

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMessenger.cxx
# Opt level: O1

MessageType __thiscall cmMessenger::ConvertMessageType(cmMessenger *this,MessageType t)

{
  if (t < FATAL_ERROR) {
    t = (MessageType)this->DevWarningsAsErrors;
  }
  else if (t - DEPRECATION_ERROR < 2) {
    return DEPRECATION_WARNING - this->DeprecatedWarningsAsErrors;
  }
  return t;
}

Assistant:

MessageType cmMessenger::ConvertMessageType(MessageType t) const
{
  if (t == MessageType::AUTHOR_WARNING || t == MessageType::AUTHOR_ERROR) {
    if (this->GetDevWarningsAsErrors()) {
      return MessageType::AUTHOR_ERROR;
    }
    return MessageType::AUTHOR_WARNING;
  }
  if (t == MessageType::DEPRECATION_WARNING ||
      t == MessageType::DEPRECATION_ERROR) {
    if (this->GetDeprecatedWarningsAsErrors()) {
      return MessageType::DEPRECATION_ERROR;
    }
    return MessageType::DEPRECATION_WARNING;
  }
  return t;
}